

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

AttributeSpec *
deqp::gls::DrawTestSpec::AttributeSpec::createAttributeArray
          (InputType inputType,OutputType outputType,Storage storage,Usage usage,int componentCount,
          int offset,int stride,bool normalize,int instanceDivisor)

{
  AttributeSpec *in_RDI;
  int in_stack_00000008;
  int in_stack_00000020;
  
  in_RDI->useDefaultAttribute = false;
  in_RDI->additionalPositionAttribute = false;
  in_RDI->bgraComponentOrder = false;
  in_RDI->inputType = inputType;
  in_RDI->outputType = outputType;
  in_RDI->storage = storage;
  in_RDI->usage = usage;
  in_RDI->componentCount = componentCount;
  in_RDI->offset = in_stack_00000008;
  in_RDI->stride = offset;
  in_RDI->normalize = stride._0_1_;
  in_RDI->instanceDivisor = in_stack_00000020;
  return in_RDI;
}

Assistant:

DrawTestSpec::AttributeSpec	DrawTestSpec::AttributeSpec::createAttributeArray (InputType inputType, OutputType outputType, Storage storage, Usage usage, int componentCount, int offset, int stride, bool normalize, int instanceDivisor)
{
	DrawTestSpec::AttributeSpec spec;

	spec.inputType			= inputType;
	spec.outputType			= outputType;
	spec.storage			= storage;
	spec.usage				= usage;
	spec.componentCount		= componentCount;
	spec.offset				= offset;
	spec.stride				= stride;
	spec.normalize			= normalize;
	spec.instanceDivisor	= instanceDivisor;

	spec.useDefaultAttribute= false;

	return spec;
}